

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O3

UBool icu_63::UCharsTrie::findUniqueValue(UChar *pos,UBool haveUniqueValue,int32_t *uniqueValue)

{
  UChar UVar1;
  uint uVar2;
  ulong uVar3;
  UChar *pUVar4;
  uint uVar5;
  UChar *pos_00;
  
  uVar3 = (ulong)(ushort)*pos;
  pos_00 = pos + 1;
  do {
    while( true ) {
      while (uVar2 = (uint)uVar3, uVar2 < 0x30) {
        if (uVar2 == 0) {
          uVar2 = (uint)(ushort)*pos_00;
          pos_00 = pos_00 + 1;
        }
        pUVar4 = findUniqueValueFromBranch(pos_00,uVar2 + 1,haveUniqueValue,uniqueValue);
        if (pUVar4 == (UChar *)0x0) {
          return '\0';
        }
        pos_00 = pUVar4 + 1;
        haveUniqueValue = '\x01';
        uVar3 = (ulong)(ushort)*pUVar4;
      }
      if (0x3f < uVar2) break;
      pUVar4 = pos_00 + (uVar2 - 0x2f);
      pos_00 = pUVar4 + 1;
      uVar3 = (ulong)(ushort)*pUVar4;
    }
    if (uVar2 < 0x8000) {
      if (uVar2 < 0x4040) {
        uVar5 = (int)(uVar3 >> 6) - 1;
      }
      else {
        if (0x7fbf < uVar2) {
          uVar5 = (uint)(ushort)*pos_00 << 0x10;
          UVar1 = pos_00[1];
          goto LAB_0032eaf1;
        }
        uVar5 = (uVar2 & 0x7fc0) * 0x400 + (uint)(ushort)*pos_00 + 0xfeff0000;
      }
    }
    else {
      uVar5 = uVar2 & 0x7fff;
      if (0x3fff < uVar5) {
        if (uVar5 == 0x7fff) {
          uVar5 = (uint)(ushort)*pos_00 << 0x10;
          pUVar4 = pos_00 + 1;
        }
        else {
          uVar5 = uVar5 * 0x10000 + 0xc0000000;
          pUVar4 = pos_00;
        }
        UVar1 = *pUVar4;
LAB_0032eaf1:
        uVar5 = (ushort)UVar1 | uVar5;
      }
    }
    if (haveUniqueValue == '\0') {
      *uniqueValue = uVar5;
      haveUniqueValue = '\x01';
    }
    else if (uVar5 != *uniqueValue) {
      return '\0';
    }
    if (0x7fff < uVar2) {
      return '\x01';
    }
    if (0x403f < uVar2) {
      if (uVar2 < 0x7fc0) {
        pos_00 = pos_00 + 1;
      }
      else {
        pos_00 = pos_00 + 2;
      }
    }
    uVar3 = (ulong)(uVar2 & 0x3f);
  } while( true );
}

Assistant:

UBool
UCharsTrie::findUniqueValue(const UChar *pos, UBool haveUniqueValue, int32_t &uniqueValue) {
    int32_t node=*pos++;
    for(;;) {
        if(node<kMinLinearMatch) {
            if(node==0) {
                node=*pos++;
            }
            pos=findUniqueValueFromBranch(pos, node+1, haveUniqueValue, uniqueValue);
            if(pos==NULL) {
                return FALSE;
            }
            haveUniqueValue=TRUE;
            node=*pos++;
        } else if(node<kMinValueLead) {
            // linear-match node
            pos+=node-kMinLinearMatch+1;  // Ignore the match units.
            node=*pos++;
        } else {
            UBool isFinal=(UBool)(node>>15);
            int32_t value;
            if(isFinal) {
                value=readValue(pos, node&0x7fff);
            } else {
                value=readNodeValue(pos, node);
            }
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return FALSE;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
            if(isFinal) {
                return TRUE;
            }
            pos=skipNodeValue(pos, node);
            node&=kNodeTypeMask;
        }
    }
}